

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QList<QTzType> *
parseTzIndicators(QList<QTzType> *__return_storage_ptr__,QDataStream *ds,QList<QTzType> *types,
                 int tzh_ttisstdcnt,int tzh_ttisgmtcnt)

{
  Status SVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  bool temp;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QTzType *)&DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<QTzType>::QArrayDataPointer(&__return_storage_ptr__->d,&types->d);
  local_39 = true;
  iVar2 = 0;
  if (0 < tzh_ttisstdcnt) {
    iVar2 = tzh_ttisstdcnt;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    SVar1 = QDataStream::status(ds);
    if (SVar1 != Ok) break;
    QDataStream::operator>>(ds,&local_39);
  }
  iVar2 = 0;
  if (0 < tzh_ttisgmtcnt) {
    iVar2 = tzh_ttisgmtcnt;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    SVar1 = QDataStream::status(ds);
    if (SVar1 != Ok) break;
    QDataStream::operator>>(ds,&local_39);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QList<QTzType> parseTzIndicators(QDataStream &ds, const QList<QTzType> &types, int tzh_ttisstdcnt,
                                        int tzh_ttisgmtcnt)
{
    QList<QTzType> result = types;
    bool temp;
    /*
      Scan and discard indicators.

      These indicators are only of use (by the date program) when "handling
      POSIX-style time zone environment variables".  The flags here say whether
      the *specification* of the zone gave the time in UTC, local standard time
      or local wall time; but whatever was specified has been digested for us,
      already, by the zone-info compiler (zic), so that the tz_time values read
      from the file (by parseTzTransitions) are all in UTC.
     */

    // Scan tzh_ttisstdcnt x 1-byte standard/wall indicators
    for (int i = 0; i < tzh_ttisstdcnt && ds.status() == QDataStream::Ok; ++i)
        ds >> temp;

    // Scan tzh_ttisgmtcnt x 1-byte UTC/local indicators
    for (int i = 0; i < tzh_ttisgmtcnt && ds.status() == QDataStream::Ok; ++i)
        ds >> temp;

    return result;
}